

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.hpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Tile<Color>::generate_reflection_map
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Symmetry *symmetry)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  allocator_type local_29;
  ulong local_28 [4];
  
  switch(*symmetry) {
  case X:
    local_28[0] = local_28[0] & 0xffffffff00000000;
    __l._M_len = 1;
    __l._M_array = (iterator)local_28;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,__l,&local_29);
    break;
  case T:
    local_28[0] = 0x300000000;
    local_28[1] = 0x100000002;
    __l_03._M_len = 4;
    __l_03._M_array = (iterator)local_28;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,__l_03,&local_29);
    break;
  case I:
    local_28[0] = 0x100000000;
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)local_28;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,__l_01,&local_29);
    break;
  case L:
    local_28[0] = 1;
    local_28[1] = 0x200000003;
    __l_02._M_len = 4;
    __l_02._M_array = (iterator)local_28;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,__l_02,&local_29);
    break;
  case backslash:
    local_28[0] = 1;
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_28;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,__l_00,&local_29);
    break;
  default:
    local_28[2] = 0x300000000;
    local_28[3] = 0x100000002;
    local_28[0] = 0x700000004;
    local_28[1] = 0x500000006;
    __l_04._M_len = 8;
    __l_04._M_array = (iterator)local_28;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,__l_04,&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<unsigned>
		generate_reflection_map(const Symmetry &symmetry) noexcept {
		switch (symmetry) {
		case Symmetry::X:
			return { 0 };
		case Symmetry::I:
			return { 0, 1 };
		case Symmetry::backslash:
			return { 1, 0 };
		case Symmetry::T:
			return { 0, 3, 2, 1 };
		case Symmetry::L:
			return { 1, 0, 3, 2 };
		case Symmetry::P:
		default:
			return { 4, 7, 6, 5, 0, 3, 2, 1 };
		}
	}